

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O0

bool hwl::statement(state *ps,Statement *psVal)

{
  combinator_list fs;
  combinator_list fs_00;
  combinator_list fs_01;
  state *in_stack_fffffffffffffd68;
  function<bool_(parser::state_&)> *in_stack_fffffffffffffd70;
  combinator *in_stack_fffffffffffffd78;
  iterator in_stack_fffffffffffffd80;
  Statement *in_stack_fffffffffffffd88;
  combinator *in_stack_fffffffffffffdb8;
  Statement *in_stack_fffffffffffffdc0;
  ind in_stack_fffffffffffffdc8;
  undefined1 **local_218;
  undefined1 **local_200;
  undefined1 **local_1e8;
  undefined1 *local_190 [8];
  undefined8 *local_150;
  undefined8 local_148;
  undefined1 *local_140 [8];
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 *local_d0;
  undefined1 *local_c8 [4];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined8 *local_68;
  undefined8 local_60;
  byte local_1;
  
  local_d0 = local_c8;
  std::function<bool(parser::state&)>::function<bool(&)(parser::state&),void>
            (in_stack_fffffffffffffd80,(_func_bool_state_ptr *)in_stack_fffffffffffffd78);
  std::function<bool(parser::state&)>::function<bool(&)(parser::state&),void>
            (in_stack_fffffffffffffd80,(_func_bool_state_ptr *)in_stack_fffffffffffffd78);
  local_f8 = 2;
  fs._M_len = (size_type)in_stack_fffffffffffffd88;
  fs._M_array = in_stack_fffffffffffffd80;
  local_100 = local_140;
  parser::choice(fs);
  parser::look_not(in_stack_fffffffffffffd78);
  local_d0 = (undefined8 *)local_a8;
  std::function<bool(parser::state&)>::function<bool(&)(parser::state&),void>
            (in_stack_fffffffffffffd80,(_func_bool_state_ptr *)in_stack_fffffffffffffd78);
  local_d0 = (undefined8 *)local_88;
  parser::bind<hwl::Statement>
            (in_stack_fffffffffffffd88,(nonterminal<hwl::Statement>)in_stack_fffffffffffffd80);
  parser::bind<hwl::Statement>
            (in_stack_fffffffffffffd88,(nonterminal<hwl::Statement>)in_stack_fffffffffffffd80);
  local_150 = local_190;
  local_148 = 2;
  fs_00._M_len = (size_type)in_stack_fffffffffffffd88;
  fs_00._M_array = in_stack_fffffffffffffd80;
  parser::choice(fs_00);
  local_68 = local_c8;
  local_60 = 3;
  fs_01._M_len = (size_type)in_stack_fffffffffffffd88;
  fs_01._M_array = in_stack_fffffffffffffd80;
  parser::sequence(fs_01);
  parser::memoize<hwl::Statement>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_1 = std::function<bool_(parser::state_&)>::operator()
                      (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f90e);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f91b);
  local_1e8 = (undefined1 **)&local_68;
  do {
    local_1e8 = local_1e8 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f950);
  } while (local_1e8 != local_c8);
  local_200 = (undefined1 **)&local_150;
  do {
    local_200 = local_200 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f9a2);
  } while (local_200 != local_190);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f9cc);
  local_218 = (undefined1 **)&local_100;
  do {
    local_218 = local_218 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11f9fb);
  } while (local_218 != local_140);
  return (bool)(local_1 & 1);
}

Assistant:

bool statement(parser::state& ps, Statement                & psVal) {
		return parser::memoize(7, psVal, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						indent,
						dedent})),
				_,
				
					parser::choice({
						parser::bind(psVal, call),
						parser::bind(psVal, if_stmt)})}))(ps);
	}